

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemViewPrivate::fetchMore(QAbstractItemViewPrivate *this)

{
  byte bVar1;
  int iVar2;
  QAbstractItemView *pQVar3;
  ulong uVar4;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int last;
  QRect rect;
  QModelIndex index;
  QWidget *in_stack_ffffffffffffff18;
  QAbstractItemModel *pQVar5;
  QPersistentModelIndex local_b8 [3];
  QRect local_a0;
  undefined1 local_90 [16];
  QPersistentModelIndex local_80 [3];
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  QPersistentModelIndex local_50 [3];
  QPersistentModelIndex local_38 [3];
  QPersistentModelIndex local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicTimer::stop();
  pQVar5 = in_RDI->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(local_20);
  bVar1 = (**(code **)(*(long *)pQVar5 + 0x130))(pQVar5,local_20);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    pQVar5 = in_RDI->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_38);
    iVar2 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,local_38);
    if (iVar2 + -1 < 0) {
      pQVar5 = in_RDI->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_50);
      (**(code **)(*(long *)pQVar5 + 0x128))(pQVar5,local_50);
    }
    else {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar5 = in_RDI->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_80);
      (**(code **)(*(long *)pQVar5 + 0x60))(&local_68,pQVar5,iVar2 + -1,0,local_80);
      local_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = q_func(in_RDI);
      local_90 = (**(code **)(*(long *)&(pQVar3->super_QAbstractScrollArea).super_QFrame.
                                        super_QWidget + 0x1e0))(pQVar3,&local_68);
      local_a0 = QWidget::rect(in_stack_ffffffffffffff18);
      uVar4 = QRect::intersects((QRect *)&local_a0);
      if ((uVar4 & 1) != 0) {
        pQVar5 = in_RDI->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_b8);
        (**(code **)(*(long *)pQVar5 + 0x128))(pQVar5,local_b8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::fetchMore()
{
    fetchMoreTimer.stop();
    if (!model->canFetchMore(root))
        return;
    int last = model->rowCount(root) - 1;
    if (last < 0) {
        model->fetchMore(root);
        return;
    }

    QModelIndex index = model->index(last, 0, root);
    QRect rect = q_func()->visualRect(index);
    if (viewport->rect().intersects(rect))
        model->fetchMore(root);
}